

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.cpp
# Opt level: O1

void __thiscall FIX::message_order::message_order(message_order *this,int *order,int size)

{
  this->m_mode = group;
  *(undefined8 *)&this->m_delim = 0;
  *(undefined8 *)((long)&(this->m_groupOrder).m_size + 4) = 0;
  *(undefined8 *)((long)&(this->m_groupOrder).m_buffer + 4) = 0;
  setOrder(this,order,size);
  return;
}

Assistant:

message_order::message_order(const int order[], int size)
    : m_mode(group),
      m_delim(0),
      m_largest(0) {
  setOrder(order, size);
}